

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O1

double __thiscall sector_t::FindNextLowestCeiling(sector_t *this,vertex_t **v)

{
  double dVar1;
  line_t_conflict *plVar2;
  bool bVar3;
  vertex_t *pvVar4;
  long lVar5;
  sector_t_conflict *other;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (this->linecount == 0) {
    dVar6 = this->planes[1].TexZ;
  }
  else {
    pvVar4 = (*this->lines)->v1;
    dVar6 = ((this->ceilingplane).normal.Y * (pvVar4->p).Y +
            (this->ceilingplane).normal.X * (pvVar4->p).X + (this->ceilingplane).D) *
            (this->ceilingplane).negiC;
    if (0 < this->linecount) {
      dVar7 = 3.4028234663852886e+38;
      lVar5 = 0;
      do {
        plVar2 = this->lines[lVar5];
        if ((plVar2->flags & 4) == 0) {
          other = (sector_t_conflict *)0x0;
        }
        else {
          other = plVar2->frontsector;
          if (plVar2->frontsector == (sector_t_conflict *)this) {
            other = (sector_t_conflict *)0x0;
            if (plVar2->backsector != (sector_t_conflict *)this) {
              other = plVar2->backsector;
            }
          }
        }
        if (other != (sector_t_conflict *)0x0) {
          dVar8 = (plVar2->v1->p).X;
          dVar1 = (plVar2->v1->p).Y;
          dVar9 = ((other->ceilingplane).normal.Y * dVar1 +
                  (other->ceilingplane).normal.X * dVar8 + (other->ceilingplane).D) *
                  (other->ceilingplane).negiC;
          dVar8 = (dVar1 * (this->ceilingplane).normal.Y +
                  dVar8 * (this->ceilingplane).normal.X + (this->ceilingplane).D) *
                  (this->ceilingplane).negiC;
          if ((dVar9 < dVar8) && (dVar8 = dVar8 - dVar9, dVar8 < dVar7)) {
            bVar3 = IsLinked(this,other,true);
            if (!bVar3) {
              pvVar4 = plVar2->v1;
              dVar6 = dVar9;
              dVar7 = dVar8;
            }
          }
          dVar8 = (plVar2->v2->p).X;
          dVar1 = (plVar2->v2->p).Y;
          dVar9 = ((other->ceilingplane).normal.Y * dVar1 +
                  (other->ceilingplane).normal.X * dVar8 + (other->ceilingplane).D) *
                  (other->ceilingplane).negiC;
          dVar8 = (dVar1 * (this->ceilingplane).normal.Y +
                  dVar8 * (this->ceilingplane).normal.X + (this->ceilingplane).D) *
                  (this->ceilingplane).negiC;
          if ((dVar9 < dVar8) && (dVar8 = dVar8 - dVar9, dVar8 < dVar7)) {
            bVar3 = IsLinked(this,other,true);
            if (!bVar3) {
              pvVar4 = plVar2->v2;
              dVar6 = dVar9;
              dVar7 = dVar8;
            }
          }
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < this->linecount);
    }
    if (v != (vertex_t **)0x0) {
      *v = pvVar4;
    }
  }
  return dVar6;
}

Assistant:

double sector_t::FindNextLowestCeiling (vertex_t **v) const
{
	double height;
	double heightdiff;
	double oceil, ceil;
	sector_t *other;
	vertex_t *spot;
	line_t *check;
	int i;


	if (linecount == 0) return GetPlaneTexZ(sector_t::ceiling);

	spot = lines[0]->v1;
	height = ceilingplane.ZatPoint(spot);
	heightdiff = FLT_MAX;

	for (i = 0; i < linecount; i++)
	{
		check = lines[i];
		if (NULL != (other = getNextSector (check, this)))
		{
			oceil = other->ceilingplane.ZatPoint(check->v1);
			ceil = ceilingplane.ZatPoint(check->v1);
			if (oceil < ceil && ceil - oceil < heightdiff && !IsLinked(other, true))
			{
				heightdiff = ceil - oceil;
				height = oceil;
				spot = check->v1;
			}
			oceil = other->ceilingplane.ZatPoint(check->v2);
			ceil = ceilingplane.ZatPoint(check->v2);
			if (oceil < ceil && ceil - oceil < heightdiff && !IsLinked(other, true))
			{
				heightdiff = ceil - oceil;
				height = oceil;
				spot = check->v2;
			}
		}
	}
	if (v != NULL)
		*v = spot;
	return height;
}